

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall
basisu::vector<basist::ktx2_transcoder::key_value>::~vector
          (vector<basist::ktx2_transcoder::key_value> *this)

{
  key_value *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  if ((in_RDI->m_key).m_p != (uchar *)0x0) {
    scalar_type<basist::ktx2_transcoder::key_value>::destruct_array
              (in_RDI,in_stack_ffffffffffffffe8);
    free((in_RDI->m_key).m_p);
  }
  return;
}

Assistant:

inline ~vector()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
         }
      }